

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O1

void FastPForLib::__unpack_tight<9u,true>(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  auVar3 = vpmovzxbd_avx512f(_DAT_0014cc50);
  lVar2 = 0;
  auVar4 = vpbroadcastd_avx512f(ZEXT416(0x1f));
  auVar5 = vpbroadcastd_avx512f(ZEXT416(0x17));
  auVar6 = vbroadcastss_avx512f(ZEXT416(0x1ff));
  auVar7 = vpbroadcastd_avx512f(ZEXT416(0x90));
  do {
    auVar8 = vpandd_avx512f(auVar3,auVar4);
    vpsrld_avx512f(auVar3,5);
    auVar9 = vpgatherdd_avx512f(in[(long)out]);
    auVar10 = vpsrlvd_avx512f(auVar9,auVar8);
    auVar10 = vmovdqu64_avx512f(auVar10);
    *(undefined1 (*) [64])(out + lVar2) = auVar10;
    uVar1 = vpcmpgtd_avx512f(auVar8,auVar5);
    auVar10 = vpgatherdd_avx512f(in[(long)out + 1]);
    auVar11._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar10._4_4_;
    auVar11._0_4_ = (uint)((byte)uVar1 & 1) * auVar10._0_4_;
    auVar11._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar10._8_4_;
    auVar11._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar10._12_4_;
    auVar11._16_4_ = (uint)((byte)(uVar1 >> 4) & 1) * auVar10._16_4_;
    auVar11._20_4_ = (uint)((byte)(uVar1 >> 5) & 1) * auVar10._20_4_;
    auVar11._24_4_ = (uint)((byte)(uVar1 >> 6) & 1) * auVar10._24_4_;
    auVar11._28_4_ = (uint)((byte)(uVar1 >> 7) & 1) * auVar10._28_4_;
    auVar11._32_4_ = (uint)((byte)(uVar1 >> 8) & 1) * auVar10._32_4_;
    auVar11._36_4_ = (uint)((byte)(uVar1 >> 9) & 1) * auVar10._36_4_;
    auVar11._40_4_ = (uint)((byte)(uVar1 >> 10) & 1) * auVar10._40_4_;
    auVar11._44_4_ = (uint)((byte)(uVar1 >> 0xb) & 1) * auVar10._44_4_;
    auVar11._48_4_ = (uint)((byte)(uVar1 >> 0xc) & 1) * auVar10._48_4_;
    auVar11._52_4_ = (uint)((byte)(uVar1 >> 0xd) & 1) * auVar10._52_4_;
    auVar11._56_4_ = (uint)((byte)(uVar1 >> 0xe) & 1) * auVar10._56_4_;
    auVar11._60_4_ = (uint)(byte)(uVar1 >> 0xf) * auVar10._60_4_;
    auVar10 = vpshrdvd_avx512_vbmi2(auVar9,auVar11,auVar8);
    auVar10 = vmovdqu32_avx512f(auVar10);
    *(undefined1 (*) [64])(out + lVar2) = auVar10;
    auVar10 = vandps_avx512dq(auVar6,*(undefined1 (*) [64])(out + lVar2));
    *(undefined1 (*) [64])(out + lVar2) = auVar10;
    lVar2 = lVar2 + 0x10;
    auVar3 = vpaddd_avx512f(auVar3,auVar7);
  } while (lVar2 != 0x20);
  return;
}

Assistant:

void __unpack_tight(const uint32_t *__restrict__ in,
                    uint32_t *__restrict__ out) {
  assert(bit <= 32);
  if (bit == 32) {
    for (int k = 0; k < 32; ++k) {
      out[k] = in[k];
    }
    return;
  }
  if (bit == 16) {
    for (uint32_t outer = 0; outer < 16; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 16)
        *(out++) = __bitmask<bit, mask>((*in) >> inwordpointer);
      ++in;
    }
    return;
  }
  if (bit == 8) {
    for (uint32_t outer = 0; outer < 8; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 8)
        *(out++) = __bitmask<bit, mask>((*in) >> inwordpointer);
      ++in;
    }
    return;
  }

#if !defined(_MSC_VER) && !defined(__INTEL_COMPILER)
  enum { mygcd = gcd(bit, 32) };
#else
  const uint32_t mygcd = gcd(bit, 32);
#endif

  for (uint32_t t = 0; t < mygcd; ++t) {
    for (uint32_t pointer = 0; pointer < 32 * bit / mygcd; pointer += bit) {
      const uint32_t inword = (pointer % 32);
      *out = in[pointer / 32] >> inword;
      if (inword > 32 - bit)
        *out |= (in[pointer / 32 + 1] << (32 - inword));
      *out = __bitmask<bit, mask>(*out);
      ++out;
    }
    in += bit / mygcd;
  }
  return;
}